

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JaegerPropagator.h
# Opt level: O1

SpanContext * __thiscall
jaegertracing::propagation::
JaegerPropagator<const_opentracing::v3::HTTPHeadersReader_&,_const_opentracing::v3::HTTPHeadersWriter_&>
::doExtract(SpanContext *__return_storage_ptr__,
           JaegerPropagator<const_opentracing::v3::HTTPHeadersReader_&,_const_opentracing::v3::HTTPHeadersWriter_&>
           *this,HTTPHeadersReader *reader)

{
  _Tuple_impl<0UL,_jaegertracing::metrics::Counter_*,_std::default_delete<jaegertracing::metrics::Counter>_>
  _Var1;
  char cVar2;
  uint64_t spanID;
  uint64_t parentID;
  uchar flags;
  string local_198;
  undefined8 *local_178;
  undefined8 uStack_170;
  code *local_168;
  code *pcStack_160;
  string local_158;
  StrMap baggage;
  SpanContext ctx;
  
  ctx._baggage._M_h._M_buckets = &ctx._baggage._M_h._M_single_bucket;
  ctx.super_SpanContext._vptr_SpanContext = (_func_int **)&PTR__SpanContext_00274328;
  ctx._traceID._high = 0;
  ctx._traceID._low = 0;
  ctx._spanID = 0;
  ctx._parentID = 0;
  ctx._flags = '\0';
  ctx._baggage._M_h._M_bucket_count = 1;
  ctx._baggage._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  ctx._baggage._M_h._M_element_count = 0;
  ctx._baggage._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  ctx._baggage._M_h._M_rehash_policy._M_next_resize = 0;
  ctx._baggage._M_h._M_single_bucket = (__node_base_ptr)0x0;
  ctx._debugID._M_dataplus._M_p = (pointer)&ctx._debugID.field_2;
  ctx._debugID._M_string_length = 0;
  ctx._debugID.field_2._M_local_buf[0] = '\0';
  ctx._traceState._M_dataplus._M_p = (pointer)&ctx._traceState.field_2;
  ctx._traceState._M_string_length = 0;
  ctx._traceState.field_2._M_local_buf[0] = '\0';
  ctx._mutex.super___mutex_base._M_mutex.__align = 0;
  ctx._mutex.super___mutex_base._M_mutex._8_8_ = 0;
  ctx._mutex.super___mutex_base._M_mutex._16_8_ = 0;
  ctx._mutex.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  ctx._mutex.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  baggage._M_h._M_buckets = &baggage._M_h._M_single_bucket;
  baggage._M_h._M_bucket_count = 1;
  baggage._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  baggage._M_h._M_element_count = 0;
  baggage._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  baggage._M_h._M_rehash_policy._M_next_resize = 0;
  baggage._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_168 = (code *)0x0;
  pcStack_160 = (code *)0x0;
  local_178 = (undefined8 *)0x0;
  uStack_170 = 0;
  local_178 = (undefined8 *)operator_new(0x18);
  *local_178 = this;
  local_178[1] = &ctx;
  local_178[2] = &baggage;
  pcStack_160 = std::
                _Function_handler<opentracing::v3::expected<void,_std::error_code>_(opentracing::v3::string_view,_opentracing::v3::string_view),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jaegertracing[P]jaeger-client-cpp/src/jaegertracing/propagation/JaegerPropagator.h:40:31)>
                ::_M_invoke;
  local_168 = std::
              _Function_handler<opentracing::v3::expected<void,_std::error_code>_(opentracing::v3::string_view,_opentracing::v3::string_view),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jaegertracing[P]jaeger-client-cpp/src/jaegertracing/propagation/JaegerPropagator.h:40:31)>
              ::_M_manager;
  (**(code **)(*(long *)reader + 0x18))(&local_198,reader);
  cVar2 = (char)local_198._M_dataplus._M_p;
  if (local_168 != (code *)0x0) {
    (*local_168)(&local_178,&local_178,3);
  }
  flags = ctx._flags;
  parentID = ctx._parentID;
  spanID = ctx._spanID;
  if (((cVar2 == '\0') && (local_198.field_2._M_allocated_capacity == DAT_002807a8)) &&
     ((int)local_198._M_string_length == opentracing::v3::span_context_corrupted_error)) {
    _Var1.super__Head_base<0UL,_jaegertracing::metrics::Counter_*,_false>._M_head_impl =
         (((this->
           super_Propagator<const_opentracing::v3::HTTPHeadersReader_&,_const_opentracing::v3::HTTPHeadersWriter_&>
           )._metrics.
           super___shared_ptr<jaegertracing::metrics::Metrics,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
         _decodingErrors)._M_t.
         super___uniq_ptr_impl<jaegertracing::metrics::Counter,_std::default_delete<jaegertracing::metrics::Counter>_>
         ._M_t.
         super__Tuple_impl<0UL,_jaegertracing::metrics::Counter_*,_std::default_delete<jaegertracing::metrics::Counter>_>
         .super__Head_base<0UL,_jaegertracing::metrics::Counter_*,_false>;
    (**(code **)(*(long *)_Var1.super__Head_base<0UL,_jaegertracing::metrics::Counter_*,_false>.
                          _M_head_impl + 0x10))
              (_Var1.super__Head_base<0UL,_jaegertracing::metrics::Counter_*,_false>._M_head_impl,1)
    ;
    (__return_storage_ptr__->super_SpanContext)._vptr_SpanContext =
         (_func_int **)&PTR__SpanContext_00274328;
    (__return_storage_ptr__->_traceID)._high = 0;
    (__return_storage_ptr__->_traceID)._low = 0;
    __return_storage_ptr__->_spanID = 0;
    __return_storage_ptr__->_parentID = 0;
    __return_storage_ptr__->_flags = '\0';
    (__return_storage_ptr__->_baggage)._M_h._M_buckets =
         &(__return_storage_ptr__->_baggage)._M_h._M_single_bucket;
    (__return_storage_ptr__->_baggage)._M_h._M_bucket_count = 1;
    (__return_storage_ptr__->_baggage)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    (__return_storage_ptr__->_baggage)._M_h._M_element_count = 0;
    (__return_storage_ptr__->_baggage)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    (__return_storage_ptr__->_baggage)._M_h._M_rehash_policy._M_next_resize = 0;
    (__return_storage_ptr__->_baggage)._M_h._M_single_bucket = (__node_base_ptr)0x0;
    (__return_storage_ptr__->_debugID)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->_debugID).field_2;
    (__return_storage_ptr__->_debugID)._M_string_length = 0;
    (__return_storage_ptr__->_debugID).field_2._M_local_buf[0] = '\0';
    (__return_storage_ptr__->_traceState)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->_traceState).field_2;
    (__return_storage_ptr__->_traceState)._M_string_length = 0;
    (__return_storage_ptr__->_traceState).field_2._M_local_buf[0] = '\0';
    (__return_storage_ptr__->_mutex).super___mutex_base._M_mutex.__align = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->_mutex).super___mutex_base._M_mutex + 8) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->_mutex).super___mutex_base._M_mutex + 0x10) = 0;
    (__return_storage_ptr__->_mutex).super___mutex_base._M_mutex.__data.__list.__prev =
         (__pthread_internal_list *)0x0;
    (__return_storage_ptr__->_mutex).super___mutex_base._M_mutex.__data.__list.__next =
         (__pthread_internal_list *)0x0;
  }
  else {
    local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"");
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"");
    SpanContext::SpanContext
              (__return_storage_ptr__,&ctx._traceID,spanID,parentID,flags,&baggage,&local_198,
               &local_158);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) {
      operator_delete(local_198._M_dataplus._M_p);
    }
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&baggage._M_h);
  ctx.super_SpanContext._vptr_SpanContext = (_func_int **)&PTR__SpanContext_00274328;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)ctx._traceState._M_dataplus._M_p != &ctx._traceState.field_2) {
    operator_delete(ctx._traceState._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)ctx._debugID._M_dataplus._M_p != &ctx._debugID.field_2) {
    operator_delete(ctx._debugID._M_dataplus._M_p);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&ctx._baggage._M_h);
  return __return_storage_ptr__;
}

Assistant:

SpanContext doExtract(const Reader& reader) const override
    {
        SpanContext ctx;
        StrMap baggage;
        const auto result =
            reader.ForeachKey([this, &ctx, &baggage](const std::string& rawKey,
                                                     const std::string& value) {
                const auto key = this->normalizeKey(rawKey);
                if (key == this->_headerKeys.traceContextHeaderName()) {
                    const auto safeValue = this->decodeValue(value);
                    std::istringstream iss(safeValue);
                    if (!(iss >> ctx) || ctx == SpanContext()) {
                        return opentracing::make_expected_from_error<void>(
                            opentracing::span_context_corrupted_error);
                    }
                }
                else if (key == this->_headerKeys.jaegerBaggageHeader()) {
                    for (auto&& pair : parseCommaSeparatedMap(value)) {
                        baggage[pair.first] = pair.second;
                    }
                }
                else {
                    const auto prefix =
                        this->_headerKeys.traceBaggageHeaderPrefix();
                    if (key.size() >= prefix.size() &&
                        key.substr(0, prefix.size()) == prefix) {
                        const auto safeKey = removeBaggageKeyPrefix(key);
                        const auto safeValue = this->decodeValue(value);
                        baggage[safeKey] = safeValue;
                    }
                }

                return opentracing::make_expected();
            });

        if (!result &&
            result.error() == opentracing::span_context_corrupted_error) {
            this->_metrics->decodingErrors().inc(1);
            return SpanContext();
        }

        return SpanContext(
            ctx.traceID(), ctx.spanID(), ctx.parentID(), ctx.flags(), baggage);
    }